

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTtfTable>::emplace<QTtfTable>
          (QMovableArrayOps<QTtfTable> *this,qsizetype i,QTtfTable *args)

{
  QTtfTable **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  undefined1 *local_58;
  QArrayDataPointer<char> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size == i) {
      qVar4 = QArrayDataPointer<QTtfTable>::freeSpaceAtEnd((QArrayDataPointer<QTtfTable> *)this);
      if (qVar4 == 0) goto LAB_004428f4;
      QTtfTable::QTtfTable
                ((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr +
                 (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size,
                 args);
LAB_004429eb:
      pqVar2 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004429a8;
    }
LAB_004428f4:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QTtfTable>::freeSpaceAtBegin((QArrayDataPointer<QTtfTable> *)this);
      if (qVar4 != 0) {
        QTtfTable::QTtfTable
                  ((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004429eb;
      }
    }
  }
  QStack_50.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QTtfTable::QTtfTable((QTtfTable *)&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size != 0;
  QArrayDataPointer<QTtfTable>::detachAndGrow
            ((QArrayDataPointer<QTtfTable> *)this,(uint)(i == 0 && bVar5),1,(QTtfTable **)0x0,
             (QArrayDataPointer<QTtfTable> *)0x0);
  if (i == 0 && bVar5) {
    QTtfTable::QTtfTable
              ((this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr + -1
               ,(QTtfTable *)&local_58);
    ppQVar1 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTtfTable>).super_QArrayDataPointer<QTtfTable>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QTtfTable> *)this,i,1);
    QTtfTable::QTtfTable(local_80.displaceFrom,(QTtfTable *)&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_50);
LAB_004429a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }